

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFVerifier.cpp
# Opt level: O2

uint __thiscall llvm::DWARFVerifier::verifyDebugInfoReferences(DWARFVerifier *this)

{
  raw_ostream *prVar1;
  _Base_ptr p_Var2;
  DWARFDie DVar3;
  pair<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
  local_a0;
  DWARFDie local_68;
  uint64_t local_58;
  _Base_ptr local_50;
  DWARFUnit *local_48;
  _Base_ptr local_40;
  uint local_34;
  
  raw_ostream::operator<<(this->OS,"Verifying .debug_info references...\n");
  local_50 = (this->ReferenceToDIEOffsets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->ReferenceToDIEOffsets)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_34 = 0;
  local_48 = (DWARFUnit *)&PTR_home_00e22798;
  local_40 = p_Var2;
  for (; local_50 != p_Var2; local_50 = (_Base_ptr)std::_Rb_tree_increment(local_50)) {
    std::
    pair<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
    ::
    pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_true>
              (&local_a0,
               (pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
                *)(local_50 + 1));
    DVar3 = DWARFContext::getDIEForOffset(this->DCtx,local_a0.first);
    if (DVar3.U == (DWARFUnit *)0x0 || DVar3.Die == (DWARFDebugInfoEntry *)0x0) {
      prVar1 = error(this);
      prVar1 = raw_ostream::operator<<(prVar1,"invalid DIE reference ");
      local_68.Die = (DWARFDebugInfoEntry *)0xc003c5;
      local_68.U = local_48;
      local_58 = local_a0.first;
      prVar1 = raw_ostream::operator<<(prVar1,(format_object_base *)&local_68);
      raw_ostream::operator<<(prVar1,". Offset is in between DIEs:\n");
      local_34 = local_34 + 1;
      for (p_Var2 = local_a0.second._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var2 != &local_a0.second._M_t._M_impl.super__Rb_tree_header;
          p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
        local_68 = DWARFContext::getDIEForOffset(this->DCtx,*(uint64_t *)(p_Var2 + 1));
        prVar1 = dump(this,&local_68,0);
        raw_ostream::operator<<(prVar1,'\n');
      }
      raw_ostream::operator<<(this->OS,"\n");
      p_Var2 = local_40;
    }
    std::
    _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
    ::~_Rb_tree(&local_a0.second._M_t);
  }
  return local_34;
}

Assistant:

unsigned DWARFVerifier::verifyDebugInfoReferences() {
  // Take all references and make sure they point to an actual DIE by
  // getting the DIE by offset and emitting an error
  OS << "Verifying .debug_info references...\n";
  unsigned NumErrors = 0;
  for (const std::pair<uint64_t, std::set<uint64_t>> &Pair :
       ReferenceToDIEOffsets) {
    if (DCtx.getDIEForOffset(Pair.first))
      continue;
    ++NumErrors;
    error() << "invalid DIE reference " << format("0x%08" PRIx64, Pair.first)
            << ". Offset is in between DIEs:\n";
    for (auto Offset : Pair.second)
      dump(DCtx.getDIEForOffset(Offset)) << '\n';
    OS << "\n";
  }
  return NumErrors;
}